

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

QModelIndex * __thiscall
QCompletionModel::mapToSource
          (QModelIndex *__return_storage_ptr__,QCompletionModel *this,QModelIndex *index)

{
  long lVar1;
  QCompletionEngine *pQVar2;
  long *plVar3;
  quintptr qVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined8 local_48;
  quintptr qStack_40;
  QAbstractItemModel *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  bVar5 = QModelIndex::isValid(index);
  if (!bVar5) {
    pQVar2 = (this->engine).d;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (__return_storage_ptr__->m).ptr = (pQVar2->curParent).m.ptr;
      iVar6 = (pQVar2->curParent).c;
      qVar4 = (pQVar2->curParent).i;
      __return_storage_ptr__->r = (pQVar2->curParent).r;
      __return_storage_ptr__->c = iVar6;
      __return_storage_ptr__->i = qVar4;
      return __return_storage_ptr__;
    }
    goto LAB_005d0a2b;
  }
  pQVar2 = (this->engine).d;
  local_38 = (pQVar2->curParent).m.ptr;
  local_48._0_4_ = (pQVar2->curParent).r;
  local_48._4_4_ = (pQVar2->curParent).c;
  qStack_40 = (pQVar2->curParent).i;
  if (this->showAll == false) {
    iVar6 = QCompletionEngine::matchCount(pQVar2);
    if (iVar6 == 0) {
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __return_storage_ptr__->i = 0;
        (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
        return __return_storage_ptr__;
      }
      goto LAB_005d0a2b;
    }
    pQVar2 = (this->engine).d;
    iVar6 = index->r;
    if ((pQVar2->historyMatch).indices.v == true) {
      iVar8 = (int)(pQVar2->historyMatch).indices.vector.d.size;
      if (iVar8 <= iVar6) {
LAB_005d09cc:
        if ((pQVar2->curMatch).indices.v == true) {
          iVar7 = (pQVar2->curMatch).indices.vector.d.ptr[iVar6 - iVar8];
        }
        else {
          iVar7 = (iVar6 - iVar8) + (pQVar2->curMatch).indices.f;
        }
        goto LAB_005d09e4;
      }
      iVar7 = (pQVar2->historyMatch).indices.vector.d.ptr[iVar6];
    }
    else {
      iVar7 = (pQVar2->historyMatch).indices.f;
      iVar8 = ((pQVar2->historyMatch).indices.t - iVar7) + 1;
      if (iVar8 <= iVar6) goto LAB_005d09cc;
      iVar7 = iVar7 + iVar6;
    }
    qStack_40 = 0;
    local_38 = (QAbstractItemModel *)0x0;
    local_48 = 0xffffffffffffffff;
  }
  else {
    iVar7 = index->r;
  }
LAB_005d09e4:
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           *)(lVar1 + 0xd8));
  plVar3 = *(long **)(lVar1 + 0xd8);
  (**(code **)(*plVar3 + 0x60))(__return_storage_ptr__,plVar3,iVar7,index->c,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_005d0a2b:
  __stack_chk_fail();
}

Assistant:

QModelIndex QCompletionModel::mapToSource(const QModelIndex& index) const
{
    Q_D(const QCompletionModel);
    if (!index.isValid())
        return engine->curParent;

    int row;
    QModelIndex parent = engine->curParent;
    if (!showAll) {
        if (!engine->matchCount())
            return QModelIndex();
        Q_ASSERT(index.row() < engine->matchCount());
        QIndexMapper& rootIndices = engine->historyMatch.indices;
        if (index.row() < rootIndices.count()) {
            row = rootIndices[index.row()];
            parent = QModelIndex();
        } else {
            row = engine->curMatch.indices[index.row() - rootIndices.count()];
        }
    } else {
        row = index.row();
    }

    return d->model->index(row, index.column(), parent);
}